

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Vector4D * __thiscall
CMU462::Matrix4x4::operator*(Vector4D *__return_storage_ptr__,Matrix4x4 *this,Vector4D *x)

{
  double *pdVar1;
  int local_fc;
  Vector4D local_f8;
  int local_d4;
  Vector4D local_d0;
  int local_ac;
  Vector4D local_a8;
  int local_84;
  Vector4D local_80;
  Vector4D local_60;
  Vector4D local_40;
  Vector4D *local_20;
  Vector4D *x_local;
  Matrix4x4 *this_local;
  
  local_84 = 0;
  local_20 = x;
  x_local = this->entries;
  this_local = (Matrix4x4 *)__return_storage_ptr__;
  pdVar1 = Vector4D::operator[](x,&local_84);
  CMU462::operator*(&local_80,pdVar1,this->entries);
  local_ac = 1;
  pdVar1 = Vector4D::operator[](local_20,&local_ac);
  CMU462::operator*(&local_a8,pdVar1,this->entries + 1);
  Vector4D::operator+(&local_60,&local_80,&local_a8);
  local_d4 = 2;
  pdVar1 = Vector4D::operator[](local_20,&local_d4);
  CMU462::operator*(&local_d0,pdVar1,this->entries + 2);
  Vector4D::operator+(&local_40,&local_60,&local_d0);
  local_fc = 3;
  pdVar1 = Vector4D::operator[](local_20,&local_fc);
  CMU462::operator*(&local_f8,pdVar1,this->entries + 3);
  Vector4D::operator+(__return_storage_ptr__,&local_40,&local_f8);
  return __return_storage_ptr__;
}

Assistant:

Vector4D Matrix4x4::operator*( const Vector4D& x ) const {
    return x[0]*entries[0] + // Add up products for each matrix column.
           x[1]*entries[1] +
           x[2]*entries[2] +
           x[3]*entries[3];
  }